

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Instr * __thiscall
IR::Instr::HoistSrc1(Instr *this,OpCode assignOpcode,RegNum regNum,StackSym *newSym)

{
  IRType type;
  undefined2 valueType;
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  OpndKind OVar4;
  OpndKind OVar5;
  Opnd *src1Opnd;
  RegOpnd *this_00;
  undefined4 *puVar6;
  Instr *instr;
  StackSym *local_38;
  
  src1Opnd = UnlinkSrc1(this);
  type = src1Opnd->m_type;
  local_38 = newSym;
  if (newSym == (StackSym *)0x0) {
    local_38 = StackSym::New(type,this->m_func);
  }
  this_00 = RegOpnd::New(local_38,regNum,type,this->m_func);
  if (this->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_004b76dd;
    *puVar6 = 0;
  }
  func = this->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) goto LAB_004b76dd;
    *puVar6 = 0;
  }
  bVar3 = (this_00->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = (RegOpnd *)Opnd::Copy(&this_00->super_Opnd,func);
    bVar3 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar3 | 2;
  this->m_src1 = &this_00->super_Opnd;
  valueType = src1Opnd->m_valueType;
  Opnd::SetValueType(&this_00->super_Opnd,(ValueType)valueType);
  instr = New(assignOpcode,&this_00->super_Opnd,src1Opnd,this->m_func);
  InsertBefore(this,instr);
  if (newSym == (StackSym *)0x0) {
    OVar4 = Opnd::GetKind(src1Opnd);
    OVar5 = Opnd::GetKind(src1Opnd);
    if (OVar4 == OpndKindReg) {
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) {
LAB_004b76dd:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      StackSym::CopySymAttrs(local_38,(StackSym *)src1Opnd[1]._vptr_Opnd);
    }
    else {
      if ((((OVar5 != OpndKindIntConst) &&
           (OVar4 = Opnd::GetKind(src1Opnd), OVar4 != OpndKindInt64Const)) &&
          (OVar4 = Opnd::GetKind(src1Opnd), OVar4 != OpndKindAddr)) &&
         (OVar4 = Opnd::GetKind(src1Opnd), OVar4 != OpndKindHelperCall)) {
        return instr;
      }
      StackSym::SetIsConst(local_38);
    }
  }
  return instr;
}

Assistant:

Instr *
Instr::HoistSrc1(Js::OpCode assignOpcode, RegNum regNum, StackSym *newSym)
{
    Opnd *oldSrc, *newSrc;
    Instr * newInstr;
    IRType type;

    oldSrc = this->UnlinkSrc1();
    type = oldSrc->GetType();

    const bool creatingNewSym = !newSym;
    if(creatingNewSym)
    {
        newSym = StackSym::New(type, m_func);
    }
    newSrc = this->SetSrc1(RegOpnd::New(newSym, regNum, type, m_func));
    newSrc->SetValueType(oldSrc->GetValueType());

    newInstr = Instr::New(assignOpcode, newSrc, oldSrc, m_func);
    this->InsertBefore(newInstr);

    if(creatingNewSym)
    {
        if (oldSrc->IsRegOpnd())
        {
            newSym->CopySymAttrs(oldSrc->AsRegOpnd()->m_sym);
        }
        else if (oldSrc->IsImmediateOpnd())
        {
            newSym->SetIsConst();
        }
    }

    return newInstr;
}